

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoop(TranslateToFuzzReader *this,Type type)

{
  Name name;
  Loop *pLVar1;
  bool bVar2;
  Expression *pEVar3;
  Block *pBVar4;
  optional<wasm::Type> type_00;
  _Storage<wasm::Type,_true> local_c8;
  undefined1 local_c0;
  undefined1 local_b8 [12];
  TranslateToFuzzReader *local_a8;
  Expression *local_a0;
  size_t local_98;
  char *pcStack_90;
  Break *local_88 [3];
  Type local_70;
  Expression *local_68;
  undefined1 local_60 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> list;
  Loop *local_40;
  Loop *local_38;
  string_view local_30;
  Loop *local_20;
  Loop *ret;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ret = (Loop *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_20 = MixedArena::alloc<wasm::Loop>(&this->wasm->allocator);
  (local_20->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id =
       (uintptr_t)this_local;
  local_30 = (string_view)makeLabel(this);
  Name::operator=(&local_20->name,(Name *)&local_30);
  local_38 = local_20;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->funcContext->breakableStack,(value_type *)&local_38);
  local_40 = local_20;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->funcContext->hangStack,(value_type *)&local_40);
  bVar2 = oneIn(this,2);
  if (bVar2) {
    list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
    pEVar3 = makeMaybeBlock(this,(Type)this_local);
    local_20->body = pEVar3;
  }
  else {
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60);
    Type::Type(&local_70,none);
    local_68 = makeMaybeBlock(this,local_70);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,&local_68
              );
    local_98 = (local_20->name).super_IString.str._M_len;
    pcStack_90 = (local_20->name).super_IString.str._M_str;
    pEVar3 = makeCondition(this);
    name.super_IString.str._M_str = pcStack_90;
    name.super_IString.str._M_len = local_98;
    local_88[0] = Builder::makeBreak(&this->builder,name,(Expression *)0x0,pEVar3);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,
               (value_type *)local_88);
    local_a8 = this_local;
    local_a0 = make(this,(Type)this_local);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,&local_a0
              );
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)local_b8,(Type *)&this_local);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_b8._0_8_
    ;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_b8[8];
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_b8._9_3_;
    pBVar4 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,
                        type_00);
    local_20->body = (Expression *)pBVar4;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60);
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
            (&this->funcContext->breakableStack);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
            (&this->funcContext->hangStack);
  pLVar1 = local_20;
  std::optional<wasm::Type>::optional<wasm::Type_&,_true>
            ((optional<wasm::Type> *)&local_c8._M_value,(Type *)&this_local);
  wasm::Loop::finalize(pLVar1,local_c8,local_c0);
  return (Expression *)local_20;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoop(Type type) {
  auto* ret = wasm.allocator.alloc<Loop>();
  ret->type = type; // So we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  funcContext->hangStack.push_back(ret);
  // Either create random content, or do something more targeted
  if (oneIn(2)) {
    ret->body = makeMaybeBlock(type);
  } else {
    // Ensure a branch back. Also optionally create some loop vars.
    std::vector<Expression*> list;
    list.push_back(makeMaybeBlock(Type::none)); // Primary contents
    // Possible branch back
    list.push_back(builder.makeBreak(ret->name, nullptr, makeCondition()));
    list.push_back(make(type)); // Final element, so we have the right type
    ret->body = builder.makeBlock(list, type);
  }
  funcContext->breakableStack.pop_back();
  funcContext->hangStack.pop_back();
  ret->finalize(type);
  return ret;
}